

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Queries::DefaultsTest::testQueryParameter
          (DefaultsTest *this,GLenum pname,GLuint expected_value,GLchar *target_name)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  bool bVar4;
  MessageBuilder local_1b8;
  uint local_34;
  long lStack_30;
  GLuint value;
  Functions *gl;
  GLchar *target_name_local;
  GLuint expected_value_local;
  GLenum pname_local;
  DefaultsTest *this_local;
  
  gl = (Functions *)target_name;
  target_name_local._0_4_ = expected_value;
  target_name_local._4_4_ = pname;
  _expected_value_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar1);
  local_34 = 0;
  (**(code **)(lStack_30 + 0xa20))(this->m_query_dsa,target_name_local._4_4_,&local_34);
  err = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(err,"glGetQueryObjectuiv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x13f);
  bVar4 = (GLuint)target_name_local == local_34;
  if (!bVar4) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b8,(char (*) [49])"glGetQueryObjectuiv of query object with target "
                       );
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char **)&gl);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [17])0x2a70025);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)((long)&target_name_local + 4));
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])0x2a74301);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_34);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [11])0x2a7006b);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)&target_name_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])0x2a6e9eb);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  return bVar4;
}

Assistant:

bool DefaultsTest::testQueryParameter(const glw::GLenum pname, const glw::GLuint expected_value,
									  const glw::GLchar* target_name)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get data. */
	glw::GLuint value = 0;

	gl.getQueryObjectuiv(m_query_dsa, pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryObjectuiv have failed");

	if (expected_value != value)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glGetQueryObjectuiv of query object with target " << target_name
			<< " with parameter " << pname << " has returned " << value << ", however " << expected_value
			<< " was expected." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}